

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_4cc9d::CliqueRunner::~CliqueRunner(CliqueRunner *this)

{
  long in_RDI;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *unaff_retaddr;
  Watches<int,_(anonymous_namespace)::FlatWatchTable> *this_00;
  
  this_00 = *(Watches<int,_(anonymous_namespace)::FlatWatchTable> **)(in_RDI + 0x1488);
  if (this_00 != (Watches<int,_(anonymous_namespace)::FlatWatchTable> *)0x0) {
    operator_delete__(this_00);
  }
  gss::innards::Watches<int,_(anonymous_namespace)::FlatWatchTable>::~Watches(this_00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::~vector
            (unaff_retaddr);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::~vector
            (unaff_retaddr);
  std::shared_ptr<gss::innards::Proof>::~shared_ptr((shared_ptr<gss::innards::Proof> *)0x124a62);
  Incumbent::~Incumbent((Incumbent *)0x124a6f);
  return;
}

Assistant:

~CliqueRunner()
        {
            delete[] space;
        }